

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O0

char * __thiscall E64::blitter_ic::terminal_enter_command(blitter_ic *this,uint8_t no)

{
  uint16_t uVar1;
  ushort uVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  byte in_SIL;
  blitter_ic *in_RDI;
  size_t i;
  size_t i_1;
  uint16_t start_of_line;
  long local_20;
  ulong local_18;
  
  uVar1 = in_RDI->blit[in_SIL].cursor_position;
  uVar2 = in_RDI->blit[in_SIL].cursor_position;
  bVar3 = blit_t::get_columns(in_RDI->blit + in_SIL);
  local_18 = 0;
  while( true ) {
    bVar4 = blit_t::get_columns(in_RDI->blit + in_SIL);
    if (bVar4 <= local_18) break;
    uVar5 = terminal_get_tile(in_RDI,in_SIL,(uVar1 - uVar2 % (ushort)bVar3) + (short)local_18);
    in_RDI->blit[in_SIL].command_buffer[local_18] = uVar5;
    local_18 = local_18 + 1;
  }
  bVar3 = blit_t::get_columns(in_RDI->blit + in_SIL);
  for (local_20 = (long)(int)(bVar3 - 1); in_RDI->blit[in_SIL].command_buffer[local_20] == ' ';
      local_20 = local_20 + -1) {
  }
  in_RDI->blit[in_SIL].command_buffer[local_20 + 1] = '\0';
  return in_RDI->blit[in_SIL].command_buffer;
}

Assistant:

char *E64::blitter_ic::terminal_enter_command(uint8_t no)
{
	uint16_t start_of_line = blit[no].cursor_position - (blit[no].cursor_position % blit[no].get_columns());
	for (size_t i = 0; i < blit[no].get_columns(); i++) {
		blit[no].command_buffer[i] = terminal_get_tile(no, start_of_line + i);
	}
	size_t i = blit[no].get_columns() - 1;
	while (blit[no].command_buffer[i] == ' ') i--;
	blit[no].command_buffer[i + 1] = 0;

	return blit[no].command_buffer;
}